

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.h
# Opt level: O1

void printTreeView(int id,int tabs)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  int iVar5;
  char *__s;
  
  iVar1 = inodes[id].i_blocks[0];
  lVar4 = 0;
  do {
    if (emptyspaces[lVar4 * 0x100 + (long)iVar1 * 0x1000] != '\0') {
      iVar5 = tabs;
      if (0 < tabs) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
      __s = emptyspaces + lVar4 * 0x100 + (long)iVar1 * 0x1000;
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar3);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
      iVar5 = *(int *)(__s + 0xfc);
      if (((inodes[iVar5].i_mode == 1) && (iVar2 = strcmp(__s,"."), iVar2 != 0)) &&
         (iVar2 = strcmp(__s,".."), iVar2 != 0)) {
        printTreeView(iVar5,tabs + 1);
      }
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  return;
}

Assistant:

void printTreeView(int id, int tabs) {
    dir_block *p = getAddressByLocation_Folder(inodes[id].i_blocks[0]);
    int i;
    for (i = 0; i < 16; i++) {
        if (strcmp(p->dirs[i].name, "")) {
            printLines(tabs);
            cout << p->dirs[i].name << endl;
            int nextid = p->dirs[i].inode_id;
            if (inodes[nextid].i_mode == A_FOLDER && strcmp(p->dirs[i].name, ".") && strcmp(p->dirs[i].name, "..")) {
                printTreeView(nextid, tabs + 1);
            }
        }
    }
}